

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecordSet.cpp
# Opt level: O3

void __thiscall
KDIS::DATA_TYPE::RecordSet::RecordSet
          (RecordSet *this,RecordID ID,KUINT32 SerialNum,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *RecordValue,KUINT16 RecordCount)

{
  DataTypeBase::DataTypeBase(&this->super_DataTypeBase);
  (this->super_DataTypeBase)._vptr_DataTypeBase = (_func_int **)&PTR__RecordSet_0022b758;
  this->m_ui32RecID = ID;
  this->m_ui32RecSetSerialNum = SerialNum;
  (this->m_vui8RecVals).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vui8RecVals).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_vui8RecVals).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  SetRecordValues(this,RecordValue,RecordCount);
  return;
}

Assistant:

RecordSet::RecordSet( RecordID ID, KUINT32 SerialNum, const vector<KUINT8> & RecordValue,
                      KUINT16 RecordCount ) :
    m_ui32RecID( ID ),
    m_ui32RecSetSerialNum( SerialNum )
{
    SetRecordValues( RecordValue, RecordCount );
}